

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frobtadsappcurses.h
# Opt level: O0

void __thiscall
FrobTadsApplicationCurses::print
          (FrobTadsApplicationCurses *this,int line,int column,int attrs,char *str)

{
  type puVar1;
  uint in_ECX;
  int in_EDX;
  undefined4 in_ESI;
  FrobTadsWindow *in_RDI;
  long in_R8;
  int i;
  size_t in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  uint in_stack_ffffffffffffffcc;
  undefined4 local_24;
  
  for (local_24 = 0; *(char *)(in_R8 + local_24) != '\0'; local_24 = local_24 + 1) {
    in_stack_ffffffffffffffcc = *(byte *)(in_R8 + local_24) | in_ECX;
    puVar1 = std::unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>::operator[]
                       ((unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_> *)
                        CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                        in_stack_ffffffffffffffb8);
    *puVar1 = in_stack_ffffffffffffffcc;
  }
  puVar1 = std::unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>::operator[]
                     ((unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_> *)
                      CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                      in_stack_ffffffffffffffb8);
  *puVar1 = 0;
  std::unique_ptr<FrobTadsWindow,_std::default_delete<FrobTadsWindow>_>::operator->
            ((unique_ptr<FrobTadsWindow,_std::default_delete<FrobTadsWindow>_> *)0x21c59b);
  std::unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>::get
            ((unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_> *)
             CONCAT44(in_ESI,in_stack_ffffffffffffffc0));
  FrobTadsWindow::printStr
            (in_RDI,in_stack_ffffffffffffffcc,in_EDX,
             (chtype *)CONCAT44(in_ESI,in_stack_ffffffffffffffc0));
  return;
}

Assistant:

virtual void
    print( int line, int column, int attrs, const char* str )
    {
        int i;
        for (i = 0; str[i] != '\0'; ++i)
            this->fDispBuf[i] = static_cast<unsigned char>(str[i]) | attrs;
        this->fDispBuf[i] = '\0';
        this->fGameWindow->printStr(line, column, this->fDispBuf.get());
    }